

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::WriteAllToZip
          (GeneratorContextImpl *this,string *filename)

{
  char cVar1;
  int iVar2;
  int *piVar3;
  ostream *poVar4;
  char *pcVar5;
  _Base_ptr p_Var6;
  int error;
  ZipWriter zip_writer;
  FileOutputStream stream;
  int local_60;
  
  if (this->had_error_ == false) {
    do {
      iVar2 = open((filename->_M_dataplus)._M_p,0x241,0x1b6);
      if (-1 < iVar2) {
        google::protobuf::io::FileOutputStream::FileOutputStream(&stream,iVar2,-1);
        ZipWriter::ZipWriter(&zip_writer,(ZeroCopyOutputStream *)&stream);
        for (p_Var6 = (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &(this->files_)._M_t._M_impl.super__Rb_tree_header;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          ZipWriter::Write(&zip_writer,(string *)(p_Var6 + 1),*(string **)(p_Var6 + 2));
        }
        ZipWriter::WriteDirectory(&zip_writer);
        if (local_60 != 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,(string *)filename);
          poVar4 = std::operator<<(poVar4,": ");
          pcVar5 = strerror(local_60);
          poVar4 = std::operator<<(poVar4,pcVar5);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        cVar1 = google::protobuf::io::FileOutputStream::Close();
        if (cVar1 == '\0') {
          poVar4 = std::operator<<((ostream *)&std::cerr,(string *)filename);
          poVar4 = std::operator<<(poVar4,": ");
          pcVar5 = strerror(local_60);
          poVar4 = std::operator<<(poVar4,pcVar5);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        ZipWriter::~ZipWriter(&zip_writer);
        google::protobuf::io::FileOutputStream::~FileOutputStream(&stream);
        return true;
      }
      piVar3 = __errno_location();
      iVar2 = *piVar3;
    } while (iVar2 == 4);
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)filename);
    poVar4 = std::operator<<(poVar4,": ");
    pcVar5 = strerror(iVar2);
    std::operator<<(poVar4,pcVar5);
  }
  return false;
}

Assistant:

bool CommandLineInterface::GeneratorContextImpl::WriteAllToZip(
    const string& filename) {
  if (had_error_) {
    return false;
  }

  // Create the output file.
  int file_descriptor;
  do {
    file_descriptor =
      open(filename.c_str(), O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (file_descriptor < 0 && errno == EINTR);

  if (file_descriptor < 0) {
    int error = errno;
    cerr << filename << ": " << strerror(error);
    return false;
  }

  // Create the ZipWriter
  io::FileOutputStream stream(file_descriptor);
  ZipWriter zip_writer(&stream);

  for (map<string, string*>::const_iterator iter = files_.begin();
       iter != files_.end(); ++iter) {
    zip_writer.Write(iter->first, *iter->second);
  }

  zip_writer.WriteDirectory();

  if (stream.GetErrno() != 0) {
    cerr << filename << ": " << strerror(stream.GetErrno()) << endl;
  }

  if (!stream.Close()) {
    cerr << filename << ": " << strerror(stream.GetErrno()) << endl;
  }

  return true;
}